

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_set_behavior(archive *_a,wchar_t flags)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  wchar_t magic_test;
  wchar_t r;
  archive_read_disk *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined4 local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  local_24 = L'\0';
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else {
    if ((in_ESI & 1) == 0) {
      *(undefined4 *)(in_RDI + 0x98) = 0;
      if (*(long *)(in_RDI + 0x78) != 0) {
        *(uint *)(*(long *)(in_RDI + 0x78) + 0x30) =
             *(uint *)(*(long *)(in_RDI + 0x78) + 0x30) & 0xffffff7f;
      }
    }
    else {
      local_24 = archive_read_disk_set_atime_restored
                           ((archive *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
    if ((in_ESI & 2) == 0) {
      *(undefined4 *)(in_RDI + 0x9c) = 0;
    }
    else {
      *(undefined4 *)(in_RDI + 0x9c) = 1;
    }
    if ((in_ESI & 4) == 0) {
      *(undefined4 *)(in_RDI + 0xa0) = 0;
    }
    else {
      *(undefined4 *)(in_RDI + 0xa0) = 1;
    }
    if ((in_ESI & 8) == 0) {
      *(undefined4 *)(in_RDI + 0xa4) = 1;
    }
    else {
      *(undefined4 *)(in_RDI + 0xa4) = 0;
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int
archive_read_disk_set_behavior(struct archive *_a, int flags)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	int r = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_honor_nodump");

	if (flags & ARCHIVE_READDISK_RESTORE_ATIME)
		r = archive_read_disk_set_atime_restored(_a);
	else {
		a->restore_time = 0;
		if (a->tree != NULL)
			a->tree->flags &= ~needsRestoreTimes;
	}
	if (flags & ARCHIVE_READDISK_HONOR_NODUMP)
		a->honor_nodump = 1;
	else
		a->honor_nodump = 0;
	if (flags & ARCHIVE_READDISK_MAC_COPYFILE)
		a->enable_copyfile = 1;
	else
		a->enable_copyfile = 0;
	if (flags & ARCHIVE_READDISK_NO_TRAVERSE_MOUNTS)
		a->traverse_mount_points = 0;
	else
		a->traverse_mount_points = 1;
	return (r);
}